

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O3

void decode_nvrm_ioctl_create_dev_obj(nvrm_ioctl_create_dev_obj *s)

{
  bool bVar1;
  bool bVar2;
  
  fprintf(_stdout,"%scid: 0x%08x",nvrm_pfx,(ulong)s->cid);
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"%shandle: 0x%08x",nvrm_sep,(ulong)s->handle);
  nvrm_pfx = nvrm_sep;
  describe_nvrm_object(s->cid,s->handle,"handle");
  bVar1 = true;
  if (nvrm_show_unk_zero_fields != 0 || s->unk08 != 0) {
    fprintf(_stdout,"%sunk08: 0x%08x",nvrm_pfx);
    bVar1 = nvrm_show_unk_zero_fields == 0;
  }
  nvrm_pfx = nvrm_sep;
  if ((s->unk0c != 0) || (!bVar1)) {
    fprintf(_stdout,"%sunk0c: 0x%08x");
  }
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"%sptr: 0x%08x",nvrm_sep,(ulong)s->ptr);
  nvrm_pfx = nvrm_sep;
  bVar1 = true;
  if (nvrm_show_unk_zero_fields == 0 && s->unk14 == 0) {
    bVar2 = true;
  }
  else {
    fprintf(_stdout,"%sunk14: 0x%08x");
    bVar2 = nvrm_show_unk_zero_fields == 0;
  }
  nvrm_pfx = nvrm_sep;
  if ((s->unk18 != 0) || (!bVar2)) {
    fprintf(_stdout,"%sunk18: 0x%08x");
    bVar1 = nvrm_show_unk_zero_fields == 0;
  }
  if ((s->unk1c != 0) || (!bVar1)) {
    nvrm_pfx = nvrm_sep;
    fprintf(_stdout,"%sunk1c: 0x%08x");
  }
  nvrm_pfx = nvrm_sep;
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

static void decode_nvrm_ioctl_create_dev_obj(struct nvrm_ioctl_create_dev_obj *s)
{
	nvrm_print_cid(s, cid);
	nvrm_print_handle(s, handle, cid);
	nvrm_print_x32(s, unk08);
	nvrm_print_x32(s, unk0c);
	nvrm_print_x32(s, ptr);
	nvrm_print_x32(s, unk14);
	nvrm_print_x32(s, unk18);
	nvrm_print_x32(s, unk1c);
	nvrm_print_ln();
}